

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.h
# Opt level: O0

btVector3 __thiscall btQuantizedBvh::unQuantize(btQuantizedBvh *this,unsigned_short *vecIn)

{
  ushort uVar1;
  btScalar *pbVar2;
  ushort *in_RSI;
  long in_RDI;
  btVector3 *this_00;
  btVector3 vecOut;
  float local_2c;
  float local_28;
  float local_24;
  ushort *local_20;
  btVector3 local_10;
  
  local_20 = in_RSI;
  btVector3::btVector3(&local_10);
  uVar1 = *local_20;
  this_00 = (btVector3 *)(in_RDI + 0x28);
  pbVar2 = btVector3::getX(this_00);
  local_24 = (float)uVar1 / *pbVar2;
  uVar1 = local_20[1];
  pbVar2 = btVector3::getY(this_00);
  local_28 = (float)uVar1 / *pbVar2;
  uVar1 = local_20[2];
  pbVar2 = btVector3::getZ(this_00);
  local_2c = (float)uVar1 / *pbVar2;
  btVector3::setValue(&local_10,&local_24,&local_28,&local_2c);
  btVector3::operator+=(&local_10,(btVector3 *)(in_RDI + 8));
  return (btVector3)local_10.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3	unQuantize(const unsigned short* vecIn) const
	{
			btVector3	vecOut;
			vecOut.setValue(
			(btScalar)(vecIn[0]) / (m_bvhQuantization.getX()),
			(btScalar)(vecIn[1]) / (m_bvhQuantization.getY()),
			(btScalar)(vecIn[2]) / (m_bvhQuantization.getZ()));
			vecOut += m_bvhAabbMin;
			return vecOut;
	}